

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_unittests.cc
# Opt level: O0

void (anonymous_namespace)::test_color<color<unsigned_short,4u>>
               (color<unsigned_short,_4U> input,color<unsigned_short,_4U> output)

{
  bool bVar1;
  uint32_t uVar2;
  Type TVar3;
  unsigned_short *puVar4;
  AssertionResult gtest_ar_1;
  uint32_t i_2;
  AssertionResult gtest_ar;
  uint32_t i_1;
  uint32_t i;
  color<unsigned_short,_4U> color;
  AssertHelper *in_stack_ffffffffffffff40;
  unsigned_short *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar5;
  char *in_stack_ffffffffffffff58;
  unsigned_short *in_stack_ffffffffffffff60;
  Type type;
  uint in_stack_ffffffffffffff70;
  uint uVar6;
  AssertionResult local_70;
  uint local_5c;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_30;
  Type local_20;
  uint local_1c;
  color<unsigned_short,_4U> local_18;
  color<unsigned_short,_4U> local_10;
  color<unsigned_short,_4U> local_8;
  
  color<unsigned_short,_4U>::color(&local_18);
  local_1c = 0;
  while (uVar6 = local_1c, uVar2 = color<unsigned_short,_4U>::comps_count(&local_18), uVar6 < uVar2)
  {
    in_stack_ffffffffffffff70 = local_1c;
    puVar4 = color<unsigned_short,_4U>::operator[](&local_8,local_1c);
    color<unsigned_short,_4U>::set(&local_18,in_stack_ffffffffffffff70,*puVar4);
    local_1c = local_1c + 1;
  }
  local_20 = kSuccess;
  while (type = local_20, TVar3 = color<unsigned_short,_4U>::comps_count(&local_18), type < TVar3) {
    in_stack_ffffffffffffff60 = color<unsigned_short,_4U>::operator[](&local_18,local_20);
    color<unsigned_short,_4U>::operator[](&local_8,local_20);
    testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
              (in_stack_ffffffffffffff58,
               (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,(unsigned_short *)in_stack_ffffffffffffff40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(uVar6,in_stack_ffffffffffffff70));
      in_stack_ffffffffffffff58 =
           testing::AssertionResult::failure_message((AssertionResult *)0x11e78c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar6,in_stack_ffffffffffffff70),type,
                 (char *)in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
      testing::Message::~Message((Message *)0x11e7e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11e83f);
    local_20 = local_20 + kNonFatalFailure;
  }
  color<unsigned_short,_4U>::normalize
            ((color<unsigned_short,_4U> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_5c = 0;
  while (uVar5 = local_5c, uVar2 = color<unsigned_short,_4U>::comps_count(&local_18), uVar5 < uVar2)
  {
    puVar4 = color<unsigned_short,_4U>::operator[](&local_18,local_5c);
    color<unsigned_short,_4U>::operator[](&local_10,local_5c);
    testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
              (in_stack_ffffffffffffff58,(char *)CONCAT44(uVar5,in_stack_ffffffffffffff50),puVar4,
               (unsigned_short *)in_stack_ffffffffffffff40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(uVar6,in_stack_ffffffffffffff70));
      in_stack_ffffffffffffff40 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11e91b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar6,in_stack_ffffffffffffff70),type,
                 (char *)in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                 (char *)CONCAT44(uVar5,in_stack_ffffffffffffff50));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
      testing::Message::~Message((Message *)0x11e969);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11e9c2);
    local_5c = local_5c + 1;
  }
  return;
}

Assistant:

void test_color(ColorType input, ColorType output) {
    ColorType color;
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        color.set(i, static_cast<typename ColorType::value_type>(input[i]));
    }

    // Verify color components were set correctly
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(input[i]));
    }

    color.normalize();

    for (uint32_t  i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(output[i]));
    }
}